

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  stbi_uc *psVar9;
  long lVar10;
  stbi_uc *psVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc *psVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  stbi_uc *__dest;
  stbi__uint32 sVar25;
  byte bVar26;
  uint uVar27;
  byte bVar28;
  byte bVar29;
  uint uVar30;
  long lVar31;
  byte *pbVar32;
  byte *pbVar33;
  long lVar34;
  
  psVar2 = a->s;
  uVar1 = psVar2->img_n;
  uVar20 = (ulong)uVar1;
  if (uVar1 + 1 != out_n && uVar1 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                  ,0xf7e,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  uVar4 = x * out_n;
  psVar9 = (stbi_uc *)malloc((ulong)(uVar4 * y));
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "Out of memory";
    return 0;
  }
  uVar5 = uVar1 * x;
  uVar6 = uVar5 * depth + 7 >> 3;
  uVar7 = (uVar6 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar7 != raw_len) goto LAB_00115514;
  }
  else if (raw_len < uVar7) goto LAB_00115514;
  if (y == 0) {
    return 1;
  }
  uVar22 = (ulong)uVar4;
  lVar24 = -uVar22;
  lVar31 = (long)out_n;
  iVar8 = x - 1;
  lVar10 = -lVar31;
  uVar7 = 0;
  uVar16 = 0;
  while( true ) {
    bVar28 = *raw;
    if (4 < (ulong)bVar28) break;
    psVar9 = a->out;
    psVar14 = psVar9 + uVar4 * (int)uVar16;
    psVar11 = psVar14;
    sVar25 = x;
    uVar30 = uVar1;
    if (depth < 8) {
      if (x < uVar6) {
        __assert_fail("img_width_bytes <= x",
                      "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                      ,0xf94,
                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                     );
      }
      psVar11 = psVar14 + (uVar4 - uVar6);
      uVar30 = 1;
      sVar25 = uVar6;
    }
    if (uVar16 == 0) {
      bVar28 = ""[bVar28];
    }
    uVar15 = (ulong)uVar7;
    if (0 < (int)uVar30) {
      uVar23 = 0;
      do {
        switch(bVar28) {
        case 0:
        case 1:
        case 5:
        case 6:
          bVar26 = raw[uVar23 + 1];
          goto LAB_001156b3;
        case 2:
        case 4:
          bVar26 = psVar9[uVar23 + uVar15 + lVar24];
          break;
        case 3:
          bVar26 = psVar9[uVar23 + uVar15 + lVar24] >> 1;
          break;
        default:
          goto switchD_00115697_default;
        }
        bVar26 = bVar26 + raw[uVar23 + 1];
LAB_001156b3:
        psVar11[uVar23] = bVar26;
switchD_00115697_default:
        uVar23 = uVar23 + 1;
      } while (uVar30 != uVar23);
    }
    if (depth == 8) {
      if (uVar1 != out_n) {
        psVar11[(int)uVar1] = 0xff;
      }
      raw = raw + (long)(int)uVar1 + 1;
      lVar34 = lVar31;
    }
    else {
      raw = raw + 2;
      lVar34 = 1;
    }
    __dest = psVar11 + lVar34;
    if (depth < 8 || uVar1 == out_n) {
      uVar27 = (sVar25 - 1) * uVar1;
      switch(bVar28) {
      case 0:
        memcpy(__dest,raw,(long)(int)uVar27);
        break;
      case 1:
        if (0 < (int)uVar27) {
          uVar15 = 0;
          do {
            __dest[uVar15] = psVar11[uVar15 + (lVar34 - (int)uVar30)] + raw[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar27 != uVar15);
        }
        break;
      case 2:
        if (0 < (int)uVar27) {
          uVar23 = 0;
          do {
            __dest[uVar23] = psVar9[uVar23 + lVar34 + uVar15 + lVar24] + raw[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar27 != uVar23);
        }
        break;
      case 3:
        if (0 < (int)uVar27) {
          uVar23 = 0;
          do {
            __dest[uVar23] =
                 (char)((uint)psVar11[uVar23 + (lVar34 - (int)uVar30)] +
                        (uint)psVar9[uVar23 + lVar34 + uVar15 + lVar24] >> 1) + raw[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar27 != uVar23);
        }
        break;
      case 4:
        if (0 < (int)uVar27) {
          uVar23 = 0;
          do {
            bVar28 = psVar11[uVar23 + (lVar34 - (int)uVar30)];
            bVar26 = psVar9[uVar23 + lVar34 + uVar15 + lVar24];
            bVar29 = psVar9[uVar23 + ((lVar34 + uVar15) - (long)(int)uVar30) + lVar24];
            iVar17 = ((uint)bVar26 + (uint)bVar28) - (uint)bVar29;
            uVar12 = iVar17 - (uint)bVar28;
            uVar21 = -uVar12;
            if (0 < (int)uVar12) {
              uVar21 = uVar12;
            }
            uVar13 = iVar17 - (uint)bVar26;
            uVar12 = -uVar13;
            if (0 < (int)uVar13) {
              uVar12 = uVar13;
            }
            uVar18 = iVar17 - (uint)bVar29;
            uVar13 = -uVar18;
            if (0 < (int)uVar18) {
              uVar13 = uVar18;
            }
            if (uVar12 <= uVar13) {
              bVar29 = bVar26;
            }
            if (uVar13 < uVar21) {
              bVar28 = bVar29;
            }
            if (uVar12 < uVar21) {
              bVar28 = bVar29;
            }
            __dest[uVar23] = bVar28 + raw[uVar23];
            uVar23 = uVar23 + 1;
          } while (uVar27 != uVar23);
        }
        break;
      case 5:
        if (0 < (int)uVar27) {
          uVar15 = 0;
          do {
            __dest[uVar15] = (psVar11[uVar15 + (lVar34 - (int)uVar30)] >> 1) + raw[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar27 != uVar15);
        }
        break;
      case 6:
        if (0 < (int)uVar27) {
          uVar15 = 0;
          do {
            __dest[uVar15] = psVar11[uVar15 + (lVar34 - (int)uVar30)] + raw[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar27 != uVar15);
        }
      }
      raw = raw + (int)uVar27;
    }
    else {
      if (uVar1 + 1 != out_n) {
        __assert_fail("img_n+1 == out_n",
                      "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                      ,0xfc9,
                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                     );
      }
      if (bVar28 < 7) {
        psVar14 = psVar14 + lVar34 + lVar24;
        switch(bVar28) {
        case 0:
          for (iVar17 = iVar8; iVar17 != 0; iVar17 = iVar17 + -1) {
            if (0 < (int)uVar1) {
              uVar15 = 0;
              do {
                __dest[uVar15] = raw[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar20 != uVar15);
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar31;
          }
          break;
        case 1:
          if (iVar8 != 0) {
            psVar11 = psVar11 + lVar34 + lVar10;
            iVar17 = iVar8;
            do {
              if (0 < (int)uVar1) {
                uVar15 = 0;
                do {
                  __dest[uVar15] = psVar11[uVar15] + raw[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar20 != uVar15);
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar31;
              psVar11 = psVar11 + lVar31;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          break;
        case 2:
          for (iVar17 = iVar8; iVar17 != 0; iVar17 = iVar17 + -1) {
            if (0 < (int)uVar1) {
              uVar15 = 0;
              do {
                __dest[uVar15] = psVar14[uVar15] + raw[uVar15];
                uVar15 = uVar15 + 1;
              } while (uVar20 != uVar15);
            }
            __dest[(int)uVar1] = 0xff;
            raw = raw + (int)uVar1;
            __dest = __dest + lVar31;
            psVar14 = psVar14 + lVar31;
          }
          break;
        case 3:
          if (iVar8 != 0) {
            psVar11 = psVar11 + lVar34 + lVar10;
            iVar17 = iVar8;
            do {
              if (0 < (int)uVar1) {
                uVar15 = 0;
                do {
                  __dest[uVar15] =
                       (char)((uint)psVar11[uVar15] + (uint)psVar14[uVar15] >> 1) + raw[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar20 != uVar15);
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar31;
              psVar14 = psVar14 + lVar31;
              psVar11 = psVar11 + lVar31;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          break;
        case 4:
          if (iVar8 != 0) {
            psVar11 = psVar11 + lVar34 + lVar10;
            psVar9 = psVar9 + lVar34 + uVar15 + (lVar10 - uVar22);
            iVar17 = iVar8;
            do {
              if (0 < (int)uVar1) {
                uVar15 = 0;
                do {
                  bVar28 = psVar11[uVar15];
                  bVar26 = psVar14[uVar15];
                  bVar29 = psVar9[uVar15];
                  iVar19 = ((uint)bVar26 + (uint)bVar28) - (uint)bVar29;
                  uVar27 = iVar19 - (uint)bVar28;
                  uVar30 = -uVar27;
                  if (0 < (int)uVar27) {
                    uVar30 = uVar27;
                  }
                  uVar21 = iVar19 - (uint)bVar26;
                  uVar27 = -uVar21;
                  if (0 < (int)uVar21) {
                    uVar27 = uVar21;
                  }
                  uVar12 = iVar19 - (uint)bVar29;
                  uVar21 = -uVar12;
                  if (0 < (int)uVar12) {
                    uVar21 = uVar12;
                  }
                  if (uVar27 <= uVar21) {
                    bVar29 = bVar26;
                  }
                  if (uVar21 < uVar30) {
                    bVar28 = bVar29;
                  }
                  if (uVar27 < uVar30) {
                    bVar28 = bVar29;
                  }
                  __dest[uVar15] = bVar28 + raw[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar20 != uVar15);
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar31;
              psVar14 = psVar14 + lVar31;
              psVar11 = psVar11 + lVar31;
              psVar9 = psVar9 + lVar31;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          break;
        case 5:
          if (iVar8 != 0) {
            psVar11 = psVar11 + lVar34 + lVar10;
            iVar17 = iVar8;
            do {
              if (0 < (int)uVar1) {
                uVar15 = 0;
                do {
                  __dest[uVar15] = (psVar11[uVar15] >> 1) + raw[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar20 != uVar15);
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar31;
              psVar11 = psVar11 + lVar31;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
          break;
        case 6:
          if (iVar8 != 0) {
            psVar11 = psVar11 + lVar34 + lVar10;
            iVar17 = iVar8;
            do {
              if (0 < (int)uVar1) {
                uVar15 = 0;
                do {
                  __dest[uVar15] = psVar11[uVar15] + raw[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar20 != uVar15);
              }
              __dest[(int)uVar1] = 0xff;
              raw = raw + (int)uVar1;
              __dest = __dest + lVar31;
              psVar11 = psVar11 + lVar31;
              iVar17 = iVar17 + -1;
            } while (iVar17 != 0);
          }
        }
      }
    }
    uVar16 = uVar16 + 1;
    uVar7 = uVar7 + uVar4;
    if (uVar16 == y) {
      if (depth < 8) {
        uVar7 = x - 1;
        lVar10 = uVar22 - uVar6;
        lVar24 = (ulong)uVar7 + 1;
        uVar30 = 0;
        uVar20 = 0;
        do {
          bVar28 = 1;
          if (color == 0) {
            bVar28 = ""[(uint)depth];
          }
          psVar9 = a->out;
          pbVar32 = psVar9 + uVar4 * (int)uVar20;
          pbVar33 = pbVar32 + (uVar22 - uVar6);
          uVar16 = (ulong)uVar30;
          if (depth == 4) {
            uVar27 = uVar5;
            if (1 < (int)uVar5) {
              psVar14 = psVar9 + lVar10;
              uVar21 = uVar5;
              do {
                psVar9[uVar16] = (psVar14[uVar16] >> 4) * bVar28;
                psVar9[uVar16 + 1] = (psVar14[uVar16] & 0xf) * bVar28;
                uVar27 = uVar21 - 2;
                psVar14 = psVar14 + 1;
                psVar9 = psVar9 + 2;
                bVar3 = 3 < uVar21;
                uVar21 = uVar27;
              } while (bVar3);
              pbVar33 = psVar14 + uVar16;
              pbVar32 = psVar9 + uVar16;
            }
            if (uVar27 == 1) {
              *pbVar32 = (*pbVar33 >> 4) * bVar28;
            }
          }
          else if (depth == 2) {
            uVar27 = uVar5;
            if (3 < (int)uVar5) {
              psVar14 = psVar9 + lVar10;
              uVar21 = uVar5;
              do {
                psVar9[uVar16] = (psVar14[uVar16] >> 6) * bVar28;
                psVar9[uVar16 + 1] = (psVar14[uVar16] >> 4 & 3) * bVar28;
                psVar9[uVar16 + 2] = (psVar14[uVar16] >> 2 & 3) * bVar28;
                psVar9[uVar16 + 3] = (psVar14[uVar16] & 3) * bVar28;
                uVar27 = uVar21 - 4;
                psVar14 = psVar14 + 1;
                psVar9 = psVar9 + 4;
                bVar3 = 7 < uVar21;
                uVar21 = uVar27;
              } while (bVar3);
              pbVar33 = psVar14 + uVar16;
              pbVar32 = psVar9 + uVar16;
            }
            if (((0 < (int)uVar27) && (*pbVar32 = (*pbVar33 >> 6) * bVar28, uVar27 != 1)) &&
               (pbVar32[1] = (*pbVar33 >> 4 & 3) * bVar28, uVar27 == 3)) {
              pbVar32[2] = (*pbVar33 >> 2 & 3) * bVar28;
            }
          }
          else if (depth == 1) {
            uVar27 = uVar5;
            if (7 < (int)uVar5) {
              psVar14 = psVar9 + lVar10;
              uVar21 = uVar5;
              do {
                psVar9[uVar16] = (char)psVar14[uVar16] >> 7 & bVar28;
                psVar9[uVar16 + 1] = (char)(psVar14[uVar16] * '\x02') >> 7 & bVar28;
                psVar9[uVar16 + 2] = (char)(psVar14[uVar16] << 2) >> 7 & bVar28;
                psVar9[uVar16 + 3] = (char)(psVar14[uVar16] << 3) >> 7 & bVar28;
                psVar9[uVar16 + 4] = (char)(psVar14[uVar16] << 4) >> 7 & bVar28;
                psVar9[uVar16 + 5] = (char)(psVar14[uVar16] << 5) >> 7 & bVar28;
                psVar9[uVar16 + 6] = (char)(psVar14[uVar16] << 6) >> 7 & bVar28;
                bVar26 = bVar28;
                if ((psVar14[uVar16] & 1) == 0) {
                  bVar26 = 0;
                }
                psVar9[uVar16 + 7] = bVar26;
                uVar27 = uVar21 - 8;
                psVar14 = psVar14 + 1;
                psVar9 = psVar9 + 8;
                bVar3 = 0xf < uVar21;
                uVar21 = uVar27;
              } while (bVar3);
              pbVar33 = psVar14 + uVar16;
              pbVar32 = psVar9 + uVar16;
            }
            if (((((0 < (int)uVar27) && (*pbVar32 = (char)*pbVar33 >> 7 & bVar28, uVar27 != 1)) &&
                 ((pbVar32[1] = (char)(*pbVar33 * '\x02') >> 7 & bVar28, 2 < uVar27 &&
                  ((pbVar32[2] = (char)(*pbVar33 << 2) >> 7 & bVar28, uVar27 != 3 &&
                   (pbVar32[3] = (char)(*pbVar33 << 3) >> 7 & bVar28, 4 < uVar27)))))) &&
                (pbVar32[4] = (char)(*pbVar33 << 4) >> 7 & bVar28, uVar27 != 5)) &&
               (pbVar32[5] = (char)(*pbVar33 << 5) >> 7 & bVar28, uVar27 == 7)) {
              pbVar32[6] = (char)(*pbVar33 << 6) >> 7 & bVar28;
            }
          }
          if (uVar1 != out_n) {
            psVar9 = a->out;
            if (uVar1 == 1) {
              lVar31 = lVar24;
              if (-1 < (int)uVar7) {
                do {
                  psVar9[lVar31 * 2 + (uVar16 - 1)] = 0xff;
                  psVar9[lVar31 * 2 + (uVar16 - 2)] = psVar9[lVar31 + (uVar16 - 1)];
                  lVar34 = lVar31 + -1;
                  bVar3 = 0 < lVar31;
                  lVar31 = lVar34;
                } while (lVar34 != 0 && bVar3);
              }
            }
            else {
              if (uVar1 != 3) {
                __assert_fail("img_n == 3",
                              "/workspace/llm4binary/github/license_c_cmakelists/RayTracing[P]raytracing/src/external/stb_image.h"
                              ,0x1019,
                              "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                             );
              }
              if (-1 < (int)uVar7) {
                psVar14 = psVar9 + (ulong)uVar7 * 3 + 2 + uVar16;
                lVar31 = lVar24;
                do {
                  psVar9[lVar31 * 4 + (uVar16 - 1)] = 0xff;
                  psVar9[lVar31 * 4 + (uVar16 - 2)] = *psVar14;
                  psVar9[lVar31 * 4 + (uVar16 - 3)] = psVar14[-1];
                  psVar9[lVar31 * 4 + (uVar16 - 4)] = psVar14[-2];
                  psVar14 = psVar14 + -3;
                  lVar34 = lVar31 + -1;
                  bVar3 = 0 < lVar31;
                  lVar31 = lVar34;
                } while (lVar34 != 0 && bVar3);
              }
            }
          }
          uVar20 = uVar20 + 1;
          uVar30 = uVar30 + uVar4;
        } while (uVar20 != y);
      }
      return 1;
    }
  }
LAB_00115514:
  stbi__g_failure_reason = "Corrupt PNG";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}